

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

string * MinVR::VRDataIndex::_getTrimName
                   (string *__return_storage_ptr__,string *key,string nameSpace)

{
  long lVar1;
  istream *piVar2;
  stringstream ss;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char)key,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)key,_S_out|_S_in);
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)__return_storage_ptr__,'/');
    } while (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VRDataIndex::_getTrimName(const std::string &key,
                                     const std::string nameSpace) {

  std::string trimName;
  if (key.find('/') == std::string::npos) {
    trimName = key;

  } else {

    // This separates the key on the slashes and puts the last
    // part of it into trimName.
    std::stringstream ss(key);
    while (std::getline(ss, trimName, '/')) {};
  }

  return trimName;
}